

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigUInt.cpp
# Opt level: O3

bool __thiscall Js::BigUInt::FAdd(BigUInt *this,BigUInt *pbi)

{
  uint uVar1;
  uint32 *puVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  undefined4 *puVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  uint32 lu2;
  
  AssertValid(this,true);
  if (pbi == (BigUInt *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x158,"(pbi)","pbi");
    if (!bVar4) goto LAB_0068e2fb;
    *puVar7 = 0;
  }
  AssertValid(pbi,true);
  if (this == pbi) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x159,"(this != pbi)","this != pbi");
    if (!bVar4) {
LAB_0068e2fb:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  uVar8 = this->m_clu;
  uVar1 = pbi->m_clu;
  uVar12 = uVar1;
  if ((((int)uVar1 <= (int)uVar8) || (uVar12 = uVar8, uVar8 = uVar1, (int)uVar1 <= this->m_cluMax))
     || (bVar4 = FResize(this,uVar1 + 1), bVar4)) {
    if ((int)uVar12 < 1) {
      uVar12 = 0;
      lu2 = 0;
    }
    else {
      lVar10 = 0;
      lu2 = 0;
      do {
        iVar5 = 0;
        if (lu2 != 0) {
          iVar5 = NumberUtilities::AddLu((uint32 *)((long)this->m_prglu + lVar10),lu2);
        }
        iVar6 = NumberUtilities::AddLu
                          ((uint32 *)((long)this->m_prglu + lVar10),
                           *(uint32 *)((long)pbi->m_prglu + lVar10));
        lu2 = iVar6 + iVar5;
        lVar10 = lVar10 + 4;
      } while ((ulong)uVar12 << 2 != lVar10);
    }
    if (this->m_clu < pbi->m_clu) {
      if ((int)uVar12 < (int)uVar8) {
        lVar9 = (ulong)uVar8 - (ulong)uVar12;
        lVar10 = (ulong)uVar12 << 2;
        do {
          puVar2 = this->m_prglu;
          *(undefined4 *)((long)puVar2 + lVar10) = *(undefined4 *)((long)pbi->m_prglu + lVar10);
          if (lu2 == 0) {
            lu2 = 0;
          }
          else {
            lu2 = NumberUtilities::AddLu((uint32 *)((long)puVar2 + lVar10),lu2);
          }
          lVar10 = lVar10 + 4;
          lVar9 = lVar9 + -1;
        } while (lVar9 != 0);
      }
      this->m_clu = uVar8;
    }
    else if ((int)uVar12 < (int)uVar8 && lu2 != 0) {
      uVar11 = (ulong)uVar12;
      lVar10 = uVar11 * 4;
      do {
        uVar11 = uVar11 + 1;
        lu2 = NumberUtilities::AddLu((uint32 *)((long)this->m_prglu + lVar10),lu2);
        if (lu2 == 0) break;
        lVar10 = lVar10 + 4;
      } while ((long)uVar11 < (long)(int)uVar8);
    }
    if (lu2 != 0) {
      iVar5 = this->m_clu;
      if (this->m_cluMax <= iVar5) {
        bVar4 = FResize(this,iVar5 + 1);
        if (!bVar4) goto LAB_0068e2ea;
        iVar5 = this->m_clu;
      }
      this->m_clu = iVar5 + 1;
      this->m_prglu[iVar5] = lu2;
    }
    AssertValid(this,true);
    bVar4 = true;
  }
  else {
LAB_0068e2ea:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool BigUInt::FAdd(BigUInt *pbi)
    {
        AssertBi(this);
        AssertBi(pbi);
        Assert(this != pbi);

        int32 cluMax, cluMin;
        int32 ilu;
        int wCarry;

        if ((cluMax = m_clu) < (cluMin = pbi->m_clu))
        {
            cluMax = pbi->m_clu;
            cluMin = m_clu;
            if (cluMax > m_cluMax && !FResize(cluMax + 1))
                return false;
        }

        wCarry = 0;
        for (ilu = 0; ilu < cluMin; ilu++)
        {
            if (0 != wCarry)
                wCarry = NumberUtilities::AddLu(&m_prglu[ilu], wCarry);
            wCarry += NumberUtilities::AddLu(&m_prglu[ilu], pbi->m_prglu[ilu]);
        }

        if (m_clu < pbi->m_clu)
        {
            for (; ilu < cluMax; ilu++)
            {
                m_prglu[ilu] = pbi->m_prglu[ilu];
                if (0 != wCarry)
                    wCarry = NumberUtilities::AddLu(&m_prglu[ilu], wCarry);
            }
            m_clu = cluMax;
        }
        else
        {
            for (; 0 != wCarry && ilu < cluMax; ilu++)
                wCarry = NumberUtilities::AddLu(&m_prglu[ilu], wCarry);
        }

        if (0 != wCarry)
        {
            if (m_clu >= m_cluMax && !FResize(m_clu + 1))
                return false;
            m_prglu[m_clu++] = wCarry;
        }

        AssertBi(this);
        return true;
    }